

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O2

Cut_Cut_t *
Cut_OracleComputeCuts(Cut_Oracle_t *p,int Node,int Node0,int Node1,int fCompl0,int fCompl1)

{
  int iVar1;
  int iVar2;
  int i;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  uint *Entry;
  uint *Entry_00;
  Cut_Cut_t *Entry_01;
  Cut_Cut_t *pCut0;
  Cut_Cut_t *pCut1;
  Cut_Cut_t *pCut;
  ulong uVar6;
  void *pvVar7;
  abctime aVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  Cut_Cut_t *pCVar14;
  
  aVar5 = Abc_Clock();
  Entry = (uint *)Vec_PtrEntry(p->vCutsNew,Node0);
  Entry_00 = (uint *)Vec_PtrEntry(p->vCutsNew,Node1);
  if ((Entry == (uint *)0x0) || (Entry_00 == (uint *)0x0)) {
    __assert_fail("pList0 && pList1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutOracle.c"
                  ,0x14a,"Cut_Cut_t *Cut_OracleComputeCuts(Cut_Oracle_t *, int, int, int, int, int)"
                 );
  }
  p->fSimul = (*Entry_00 >> 0x16 & 1 ^ fCompl1) & (*Entry >> 0x16 & 1 ^ fCompl0);
  p->vCuts0->nSize = 0;
  for (; Entry != (uint *)0x0; Entry = *(uint **)(Entry + 4)) {
    Vec_PtrPush(p->vCuts0,Entry);
  }
  p->vCuts1->nSize = 0;
  for (; Entry_00 != (uint *)0x0; Entry_00 = *(uint **)(Entry_00 + 4)) {
    Vec_PtrPush(p->vCuts1,Entry_00);
  }
  iVar2 = Vec_IntEntry(p->vNodeCuts,Node);
  i = Vec_IntEntry(p->vNodeStarts,Node);
  iVar3 = Vec_IntEntry(p->vCutPairs,i);
  if (iVar3 != 0) {
    __assert_fail("Vec_IntEntry(p->vCutPairs, iCutStart) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutOracle.c"
                  ,0x15c,"Cut_Cut_t *Cut_OracleComputeCuts(Cut_Oracle_t *, int, int, int, int, int)"
                 );
  }
  Entry_01 = Cut_CutTriv(p,Node);
  iVar3 = 1;
  pCVar14 = Entry_01;
  do {
    if (iVar2 <= iVar3) {
      pCVar14->pNext = (Cut_Cut_t *)0x0;
      pvVar7 = Vec_PtrEntry(p->vCutsNew,Node);
      if (pvVar7 != (void *)0x0) {
        __assert_fail("Vec_PtrEntry( p->vCutsNew, Node ) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutOracle.c"
                      ,0x170,
                      "Cut_Cut_t *Cut_OracleComputeCuts(Cut_Oracle_t *, int, int, int, int, int)");
      }
      Vec_PtrWriteEntry(p->vCutsNew,Node,Entry_01);
      aVar8 = Abc_Clock();
      p->timeTotal = p->timeTotal + (aVar8 - aVar5);
      return Entry_01;
    }
    uVar4 = Vec_IntEntry(p->vCutPairs,iVar3 + i);
    pCut0 = (Cut_Cut_t *)Vec_PtrEntry(p->vCuts0,uVar4 & 0xffff);
    pCut1 = (Cut_Cut_t *)Vec_PtrEntry(p->vCuts1,(int)uVar4 >> 0x10);
    pCut = Cut_CutStart(p);
    uVar4 = p->pParams->nVarsMax;
    uVar9 = 0;
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar6 = uVar9;
    }
    uVar10 = 0;
    uVar4 = 0;
    for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      lVar12 = (long)(int)uVar10;
      if (uVar4 == *(uint *)pCut1 >> 0x1c) {
        if (uVar10 == *(uint *)pCut0 >> 0x1c) {
          uVar6 = uVar9 & 0xffffffff;
          goto LAB_003f620c;
        }
        uVar10 = uVar10 + 1;
        iVar11 = *(int *)(&pCut0[1].field_0x0 + lVar12 * 4);
LAB_003f61cc:
        *(int *)(&pCut[1].field_0x0 + uVar9 * 4) = iVar11;
      }
      else {
        lVar13 = (long)(int)uVar4;
        if (uVar10 == *(uint *)pCut0 >> 0x1c) {
          uVar4 = uVar4 + 1;
          iVar11 = *(int *)(&pCut1[1].field_0x0 + lVar13 * 4);
          goto LAB_003f61cc;
        }
        iVar11 = *(int *)(&pCut0[1].field_0x0 + lVar12 * 4);
        iVar1 = *(int *)(&pCut1[1].field_0x0 + lVar13 * 4);
        if (iVar11 < iVar1) {
          uVar10 = uVar10 + 1;
          goto LAB_003f61cc;
        }
        if (iVar1 < iVar11) {
          uVar4 = uVar4 + 1;
          *(int *)(&pCut[1].field_0x0 + uVar9 * 4) = iVar1;
        }
        else {
          uVar10 = uVar10 + 1;
          *(int *)(&pCut[1].field_0x0 + uVar9 * 4) = iVar11;
          uVar4 = uVar4 + 1;
        }
      }
    }
    if ((uVar10 != *(uint *)pCut0 >> 0x1c) || (uVar4 != *(uint *)pCut1 >> 0x1c)) {
      __assert_fail("i == (int)pCut0->nLeaves && k == (int)pCut1->nLeaves",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutOracle.c"
                    ,0x130,"Cut_Cut_t *Cut_CutMerge(Cut_Oracle_t *, Cut_Cut_t *, Cut_Cut_t *)");
    }
LAB_003f620c:
    *(uint *)pCut = *(uint *)pCut & 0xfffffff | (int)uVar6 << 0x1c;
    pCVar14->pNext = pCut;
    if (p->pParams->fTruth != 0) {
      Cut_TruthComputeOld(pCut,pCut0,pCut1,fCompl0,fCompl1);
    }
    iVar3 = iVar3 + 1;
    pCVar14 = pCut;
  } while( true );
}

Assistant:

Cut_Cut_t * Cut_OracleComputeCuts( Cut_Oracle_t * p, int Node, int Node0, int Node1, int fCompl0, int fCompl1 )
{
    Cut_Cut_t * pList = NULL, ** ppTail = &pList;
    Cut_Cut_t * pCut, * pCut0, * pCut1, * pList0, * pList1;
    int iCutStart, nCuts, i, Entry;
    abctime clk = Abc_Clock();

    // get the cuts of the children
    pList0 = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsNew, Node0 );
    pList1 = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsNew, Node1 );
    assert( pList0 && pList1 );

    // get the complemented attribute of the cut
    p->fSimul = (fCompl0 ^ pList0->fSimul) & (fCompl1 ^ pList1->fSimul);

    // collect the cuts
    Vec_PtrClear( p->vCuts0 );
    Cut_ListForEachCut( pList0, pCut )
        Vec_PtrPush( p->vCuts0, pCut );
    Vec_PtrClear( p->vCuts1 );
    Cut_ListForEachCut( pList1, pCut )
        Vec_PtrPush( p->vCuts1, pCut );

    // get the first and last cuts of this node
    nCuts = Vec_IntEntry(p->vNodeCuts, Node);
    iCutStart = Vec_IntEntry(p->vNodeStarts, Node);

    // create trivial cut
    assert( Vec_IntEntry(p->vCutPairs, iCutStart) == 0 );
    pCut = Cut_CutTriv( p, Node );
    *ppTail = pCut;
    ppTail = &pCut->pNext;
    // create other cuts
    for ( i = 1; i < nCuts; i++ )
    {
        Entry = Vec_IntEntry( p->vCutPairs, iCutStart + i );
        pCut0 = (Cut_Cut_t *)Vec_PtrEntry( p->vCuts0, Entry & 0xFFFF );
        pCut1 = (Cut_Cut_t *)Vec_PtrEntry( p->vCuts1, Entry >> 16 );
        pCut  = Cut_CutMerge( p, pCut0, pCut1 );
        *ppTail = pCut;
        ppTail = &pCut->pNext;
        // compute the truth table
        if ( p->pParams->fTruth )
            Cut_TruthComputeOld( pCut, pCut0, pCut1, fCompl0, fCompl1 );
    }
    *ppTail = NULL;

    // write the new cut
    assert( Vec_PtrEntry( p->vCutsNew, Node ) == NULL );
    Vec_PtrWriteEntry( p->vCutsNew, Node, pList );
p->timeTotal += Abc_Clock() - clk;
    return pList;
}